

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-save.c
# Opt level: O0

ztresult_t savehandler_uint(char *name,ztuint_t *pvalue,size_t nelems,size_t stride,void *opaque)

{
  long in_RCX;
  ulong in_RDX;
  uint *in_RSI;
  char *fmt;
  undefined8 in_RDI;
  savestate_t *in_R8;
  size_t k;
  size_t j;
  savestate_t *state;
  ulong local_40;
  ulong local_38;
  uint *local_10;
  
  if (in_RDX == 1) {
    emitf(in_R8,"%s = $%X;\n",in_RDI,(ulong)*in_RSI);
  }
  else {
    emitf(in_R8,"%s = [\n",in_RDI);
    indent(in_R8);
    local_10 = in_RSI;
    for (local_38 = 0; local_38 < in_RDX; local_38 = in_RCX + local_38) {
      for (local_40 = local_38; local_40 < local_38 + in_RCX; local_40 = local_40 + 1) {
        fmt = "$%X";
        if (local_40 < in_RDX - 1) {
          fmt = "$%X, ";
        }
        emitf(in_R8,fmt,(ulong)*local_10);
        local_10 = local_10 + 1;
      }
      emitf(in_R8,"\n");
    }
    outdent(in_R8);
    emitf(in_R8,"];\n");
  }
  return 0;
}

Assistant:

static ztresult_t savehandler_uint(const char     *name,
                                   const ztuint_t *pvalue,
                                   size_t          nelems,
                                   size_t          stride,
                                   void           *opaque)
{
  savestate_t *state = opaque;
  DUMP(word_t);
  return ztresult_OK;
}